

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

void __thiscall
Js::PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
          (PrototypeChainCache<Js::NoSpecialPropertyCache> *this)

{
  int iVar1;
  WriteBarrierPtr *this_00;
  Type **ppTVar2;
  undefined4 local_14;
  int i;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>::Count
                      ((ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer> *)this);
    if (iVar1 <= local_14) break;
    this_00 = (WriteBarrierPtr *)
              JsUtil::
              List<Js::Type_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                        (&this->types,local_14);
    ppTVar2 = Memory::WriteBarrierPtr::operator_cast_to_Type__(this_00);
    NoSpecialPropertyCache::ClearType(*ppTVar2);
    local_14 = local_14 + 1;
  }
  JsUtil::List<Js::Type_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ClearAndZero(&this->types);
  return;
}

Assistant:

void
PrototypeChainCache<T>::Clear()
{
    for (int i = 0; i < this->types.Count(); ++i)
    {
        T::ClearType(this->types.Item(i));
    }
    this->types.ClearAndZero();
}